

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer-CH.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  __pid_t _Var5;
  ostream *poVar6;
  istream *piVar7;
  int *piVar8;
  ostream *s;
  Dict *pDVar9;
  ostream *c_00;
  ostream *l;
  ostream *poVar10;
  void *this;
  size_type sVar11;
  Trainer *pTVar12;
  size_type sVar13;
  reference pvVar14;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint *puVar15;
  undefined8 *in_RSI;
  int in_EDI;
  real rVar16;
  double dVar17;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auVar19 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar20 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar23 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar25 [16];
  bool in_stack_00000233;
  uint in_stack_00000234;
  char ***in_stack_00000238;
  int *in_stack_00000240;
  undefined1 in_stack_00000267;
  ComputationGraph *in_stack_00000268;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000270;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000278;
  vector<int,_std::allocator<int>_> *in_stack_00000280;
  RNNLanguageModel<cnn::FastLSTMBuilder> *in_stack_00000288;
  double *in_stack_000002a0;
  uint *in_stack_000002a8;
  uint *in_stack_000002b0;
  text_oarchive oa;
  ofstream out;
  double F;
  double R;
  double P;
  ComputationGraph cg_1;
  Instance *sent_1;
  iterator __end3;
  iterator __begin3;
  vector<Instance,_std::allocator<Instance>_> *__range3;
  double dcorr;
  uint doverall;
  uint dpredict;
  double dloss;
  value_type *sent;
  ComputationGraph cg;
  uint i_1;
  double correct;
  uint toverall;
  uint tpredict;
  double loss;
  Timer iteration;
  uint lines;
  int report;
  bool first;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  uint si;
  uint dev_every_i_reports;
  uint report_every_i;
  text_iarchive ia;
  ifstream in_2;
  string fname_1;
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  Trainer *sgd;
  bool use_momentum;
  Model model;
  double best;
  string fname;
  ostringstream os;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  c_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y_1;
  vector<int,_std::allocator<int>_> x_1;
  ifstream in_1;
  int unk_1;
  int total_1;
  int dtoks;
  int dlc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y;
  vector<int,_std::allocator<int>_> x;
  ifstream in;
  int unk;
  int total;
  int ttoks;
  int tlc;
  string line;
  vector<Instance,_std::allocator<Instance>_> dev;
  vector<Instance,_std::allocator<Instance>_> training;
  Dict *in_stack_ffffffffffffea88;
  Model *in_stack_ffffffffffffea90;
  Model *in_stack_ffffffffffffea98;
  undefined4 in_stack_ffffffffffffeaa0;
  uint in_stack_ffffffffffffeaa4;
  ostream *in_stack_ffffffffffffeaa8;
  Dict *in_stack_ffffffffffffeab0;
  ComputationGraph *in_stack_ffffffffffffeac0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffeac8;
  Timer *in_stack_ffffffffffffead0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffead8;
  Instance *in_stack_ffffffffffffeae0;
  undefined4 in_stack_ffffffffffffeaf0;
  undefined4 in_stack_ffffffffffffeaf4;
  Dict *in_stack_ffffffffffffeaf8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__g;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffecc8;
  undefined4 in_stack_ffffffffffffecd0;
  undefined4 in_stack_ffffffffffffecd4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffecd8;
  Dict *in_stack_ffffffffffffece0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffece8;
  string *in_stack_ffffffffffffecf0;
  Dict *in_stack_ffffffffffffed00;
  int *in_stack_ffffffffffffed08;
  undefined7 in_stack_ffffffffffffed10;
  undefined1 in_stack_ffffffffffffed17;
  undefined1 local_1220 [512];
  double local_1020;
  double local_1018;
  double local_1010;
  reference local_fc0;
  Instance *local_fb8;
  __normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_> local_fb0;
  undefined1 *local_fa8;
  double local_fa0;
  undefined4 local_f98;
  Model local_f94;
  uint *local_f38;
  uint *local_f30;
  uint local_f24;
  double local_f20;
  undefined4 local_f18;
  undefined1 local_f14 [20];
  string local_f00 [72];
  undefined4 in_stack_fffffffffffff148;
  undefined4 in_stack_fffffffffffff14c;
  int iVar26;
  undefined4 in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff154;
  uint local_ea8;
  undefined1 local_ea0 [696];
  string local_be8 [808];
  Trainer *local_8c0;
  undefined1 local_8b1;
  double local_860;
  string local_858 [32];
  ostringstream local_838 [520];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_630;
  vector<int,_std::allocator<int>_> local_618;
  unsigned_long local_600 [65];
  undefined1 local_3f4 [8];
  int local_3ec;
  int local_3e8;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [152];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2b8;
  vector<int,_std::allocator<int>_> local_2a0;
  unsigned_long local_288 [65];
  undefined1 local_7c [20];
  int local_68;
  int local_64;
  string local_60 [32];
  undefined1 local_40 [24];
  vector<Instance,_std::allocator<Instance>_> local_28;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  undefined1 auVar18 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cnn::Initialize(in_stack_00000240,in_stack_00000238,in_stack_00000234,in_stack_00000233);
  if ((local_8 != 3) && (local_8 != 4)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar6 = std::operator<<(poVar6,(char *)*local_10);
    std::operator<<(poVar6," corpus.txt dev.txt [model.params]\n");
    return 1;
  }
  std::vector<Instance,_std::allocator<Instance>_>::vector
            ((vector<Instance,_std::allocator<Instance>_> *)0x389e20);
  std::vector<Instance,_std::allocator<Instance>_>::vector
            ((vector<Instance,_std::allocator<Instance>_> *)0x389e2d);
  std::__cxx11::string::string(local_60);
  local_64 = 0;
  local_68 = 0;
  poVar6 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
  poVar6 = std::operator<<(poVar6,(char *)local_10[1]);
  std::operator<<(poVar6,"...\n");
  local_7c._4_4_ = 0;
  local_7c._0_4_ = 0;
  std::ifstream::ifstream(local_288,local_10[1],8);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)local_288 + *(long *)(local_288[0] - 0x18)))
  ;
  if (!bVar2) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                  ,0x1dc,"int main(int, char **)");
  }
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_288,local_60);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar2) {
      poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,local_64);
      s = std::operator<<(poVar6," lines, ");
      pDVar9 = (Dict *)std::ostream::operator<<(s,local_68);
      c_00 = std::operator<<((ostream *)pDVar9," tokens, ");
      uVar3 = cnn::Dict::size((Dict *)0x38a357);
      l = (ostream *)std::ostream::operator<<(c_00,uVar3);
      std::operator<<(l," types\n");
      poVar10 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (poVar10,(float)(int)local_7c._0_4_ / (float)(int)local_7c._4_4_);
      std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<((ostream *)&std::cerr,"Tags: ");
      uVar4 = cnn::Dict::size((Dict *)0x38a41d);
      this = (void *)std::ostream::operator<<(poVar10,uVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::ifstream::~ifstream(local_288);
      cnn::Dict::Freeze(&wd);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"*UNK*",&local_369);
      cnn::Dict::SetUnk(in_stack_ffffffffffffeab0,(string *)in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"NULL",&local_391);
      endlabel = cnn::Dict::Convert(in_stack_ffffffffffffeaf8,
                                    (string *)
                                    CONCAT44(in_stack_ffffffffffffeaf4,in_stack_ffffffffffffeaf0));
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      cnn::Dict::Freeze(&cd);
      cnn::Dict::Freeze(&ld);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"*UNK*",&local_3b9);
      cnn::Dict::SetUnk(in_stack_ffffffffffffeab0,(string *)in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"*UNK*",&local_3e1);
      cnn::Dict::SetUnk(in_stack_ffffffffffffeab0,(string *)in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      VOCAB_SIZE = cnn::Dict::size((Dict *)0x38a640);
      CHAR_SIZE = cnn::Dict::size((Dict *)0x38a665);
      LABEL_SIZE = cnn::Dict::size((Dict *)0x38a68a);
      local_3e8 = 0;
      local_3ec = 0;
      poVar10 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
      poVar10 = std::operator<<(poVar10,(char *)local_10[2]);
      std::operator<<(poVar10,"...\n");
      local_3f4._4_4_ = 0;
      local_3f4._0_4_ = 0;
      std::ifstream::ifstream(local_600,local_10[2],8);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)local_600 + *(long *)(local_600[0] - 0x18)));
      if (!bVar2) {
        __assert_fail("in",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                      ,0x1ff,"int main(int, char **)");
      }
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_600,local_60);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (!bVar2) {
          poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,local_3e8);
          poVar6 = std::operator<<(poVar6," lines, ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3ec);
          std::operator<<(poVar6," tokens\n");
          poVar6 = std::operator<<((ostream *)&std::cerr,"OOV ratio: ");
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,(float)(int)local_3f4._0_4_ / (float)(int)local_3f4._4_4_);
          std::operator<<(poVar6,"\n");
          std::ifstream::~ifstream(local_600);
          std::__cxx11::ostringstream::ostringstream(local_838);
          poVar6 = std::operator<<((ostream *)local_838,"ordered");
          poVar6 = std::operator<<(poVar6,'_');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,LAYERS);
          poVar6 = std::operator<<(poVar6,'_');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,INPUT_DIM);
          poVar6 = std::operator<<(poVar6,'_');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,HIDDEN_DIM);
          poVar6 = std::operator<<(poVar6,"-pid");
          _Var5 = getpid();
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,_Var5);
          std::operator<<(poVar6,".params");
          std::__cxx11::ostringstream::str();
          poVar6 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
          poVar6 = std::operator<<(poVar6,local_858);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_860 = -9e+99;
          cnn::Model::Model(in_stack_ffffffffffffea90);
          local_8b1 = 1;
          local_8c0 = (Trainer *)0x0;
          pTVar12 = (Trainer *)operator_new(0x70);
          cnn::MomentumSGDTrainer::MomentumSGDTrainer
                    ((MomentumSGDTrainer *)
                     CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                     in_stack_ffffffffffffea98,(real)((ulong)in_stack_ffffffffffffea90 >> 0x20),
                     SUB84(in_stack_ffffffffffffea90,0),
                     (real)((ulong)in_stack_ffffffffffffea88 >> 0x20));
          local_8c0 = pTVar12;
          RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel
                    ((RNNLanguageModel<cnn::FastLSTMBuilder> *)
                     CONCAT44(in_stack_fffffffffffff154,in_stack_fffffffffffff150),
                     (Model *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148));
          if (local_8 == 4) {
            pcVar1 = (char *)local_10[3];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_be8,pcVar1,(allocator *)(local_ea0 + 0x2b7));
            std::allocator<char>::~allocator((allocator<char> *)(local_ea0 + 0x2b7));
            std::ifstream::ifstream(local_ea0 + 0xa8,local_be8,8);
            boost::archive::text_iarchive::text_iarchive
                      ((text_iarchive *)in_stack_ffffffffffffeab0,
                       (istream *)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa4);
            boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
                      ((interface_iarchive<boost::archive::text_iarchive> *)
                       in_stack_ffffffffffffea90,(Model *)in_stack_ffffffffffffea88);
            boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x38b09d);
            std::ifstream::~ifstream(local_ea0 + 0xa8);
            std::__cxx11::string::~string(local_be8);
          }
          local_ea0._36_4_ = 0x32;
          local_ea0._32_4_ = 0x19;
          sVar13 = std::vector<Instance,_std::allocator<Instance>_>::size(&local_28);
          local_ea0._28_4_ = (undefined4)sVar13;
          std::vector<Instance,_std::allocator<Instance>_>::size(&local_28);
          std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x38b1aa);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffeab0,(size_type)in_stack_ffffffffffffeaa8,
                     (allocator_type *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0)
                    );
          std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x38b1d6);
          for (local_ea8 = 0;
              sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ea0),
              local_ea8 < sVar13; local_ea8 = local_ea8 + 1) {
            pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ea0,
                                 (ulong)local_ea8);
            *pvVar14 = local_ea8;
          }
          uVar4 = 0x1000000;
          uVar3 = 0;
          iVar26 = 0;
          do {
            __first._M_current = (uint *)(local_f14 + 0x13);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_f14 + 0x14),"completed in",(allocator *)__first._M_current);
            cnn::Timer::Timer((Timer *)in_stack_ffffffffffffea90,(string *)in_stack_ffffffffffffea88
                             );
            std::__cxx11::string::~string((string *)(local_f14 + 0x14));
            std::allocator<char>::~allocator((allocator<char> *)(local_f14 + 0x13));
            auVar20._8_56_ = extraout_var_00;
            auVar20._0_8_ = extraout_XMM1_Qa;
            local_f14._4_8_ = (pointer)0x0;
            local_f14._0_4_ = 0;
            local_f18 = 0;
            local_f20 = 0.0;
            for (local_f24 = 0; auVar25 = auVar20._0_16_, local_f24 < (uint)local_ea0._36_4_;
                local_f24 = local_f24 + 1) {
              __last._M_current = (uint *)(ulong)(uint)local_ea0._28_4_;
              puVar15 = (uint *)std::vector<Instance,_std::allocator<Instance>_>::size(&local_28);
              if (__last._M_current == puVar15) {
                local_ea0._28_4_ = 0;
                if ((uVar4 & 0x1000000) == 0) {
                  cnn::Trainer::update_epoch(local_8c0,1.0);
                }
                else {
                  uVar4 = 0;
                }
                std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
                __g = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)local_ea0;
                local_f30 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)in_stack_ffffffffffffea88);
                local_f38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)in_stack_ffffffffffffea88);
                std::
                shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                          (__first,__last,__g);
              }
              cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffeac0);
              pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ea0,
                                   (ulong)(uint)local_ea0._28_4_);
              local_f94.params.
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._4_8_ =
                   std::vector<Instance,_std::allocator<Instance>_>::operator[]
                             (&local_28,(ulong)*pvVar14);
              local_ea0._28_4_ = local_ea0._28_4_ + 1;
              in_stack_ffffffffffffea90 = (Model *)local_f14;
              in_stack_ffffffffffffea88 = (Dict *)&local_f20;
              RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                        (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                         in_stack_00000268,in_stack_000002a0,in_stack_000002a8,in_stack_000002b0,
                         (bool)in_stack_00000267);
              cnn::ComputationGraph::forward((ComputationGraph *)0x38b537);
              rVar16 = cnn::as_scalar((Tensor *)0x38b54e);
              auVar20 = ZEXT1664(CONCAT88(extraout_XMM0_Qb,(double)rVar16));
              local_f14._4_8_ = (double)local_f14._4_8_ + (double)rVar16;
              cnn::ComputationGraph::backward((ComputationGraph *)0x38b589);
              (*local_8c0->_vptr_Trainer[2])(SUB648(ZEXT464(0x3f800000),0));
              iVar26 = iVar26 + 1;
              cnn::ComputationGraph::~ComputationGraph
                        ((ComputationGraph *)in_stack_ffffffffffffea90);
            }
            cnn::Trainer::status((Trainer *)in_stack_ffffffffffffea90);
            poVar6 = std::operator<<((ostream *)&std::cerr," E = ");
            auVar25 = vcvtusi2sd_avx512f(auVar25,local_f18);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,(double)local_f14._4_8_ / auVar25._0_8_);
            auVar21._8_56_ = extraout_var_01;
            auVar21._0_8_ = extraout_XMM1_Qa_00;
            auVar25 = auVar21._0_16_;
            poVar6 = std::operator<<(poVar6," ppl=");
            auVar25 = vcvtusi2sd_avx512f(auVar25,local_f18);
            dVar17 = exp((double)local_f14._4_8_ / auVar25._0_8_);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar17);
            auVar22._8_56_ = extraout_var_02;
            auVar22._0_8_ = extraout_XMM1_Qa_01;
            auVar25 = auVar22._0_16_;
            poVar6 = std::operator<<(poVar6," (acc=");
            auVar25 = vcvtusi2sd_avx512f(auVar25,local_f18);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_f20 / auVar25._0_8_);
            auVar23._8_56_ = extraout_var_03;
            auVar23._0_8_ = extraout_XMM1_Qa_02;
            std::operator<<(poVar6,") ");
            uVar3 = uVar3 + 1;
            if (uVar3 % (uint)local_ea0._32_4_ == 0) {
              local_f94.all_params.
              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
              _M_impl.super__Vector_impl_data._4_8_ = (pointer)0x0;
              local_f94.all_params.
              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
              local_f98 = 0;
              local_fa0 = 0.0;
              eval = true;
              local_fa8 = local_40;
              local_fb0._M_current =
                   (Instance *)
                   std::vector<Instance,_std::allocator<Instance>_>::begin
                             ((vector<Instance,_std::allocator<Instance>_> *)
                              in_stack_ffffffffffffea88);
              local_fb8 = (Instance *)
                          std::vector<Instance,_std::allocator<Instance>_>::end
                                    ((vector<Instance,_std::allocator<Instance>_> *)
                                     in_stack_ffffffffffffea88);
              while( true ) {
                auVar25 = auVar23._0_16_;
                bVar2 = __gnu_cxx::operator!=
                                  ((__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>
                                    *)in_stack_ffffffffffffea90,
                                   (__normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>
                                    *)in_stack_ffffffffffffea88);
                if (!bVar2) break;
                local_fc0 = __gnu_cxx::
                            __normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>
                            ::operator*(&local_fb0);
                cnn::ComputationGraph::ComputationGraph(in_stack_ffffffffffffeac0);
                in_stack_ffffffffffffea90 = &local_f94;
                in_stack_ffffffffffffea88 = (Dict *)&local_fa0;
                RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                          (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                           in_stack_00000268,in_stack_000002a0,in_stack_000002a8,in_stack_000002b0,
                           (bool)in_stack_00000267);
                cnn::ComputationGraph::forward((ComputationGraph *)0x38b859);
                rVar16 = cnn::as_scalar((Tensor *)0x38b86a);
                auVar23 = ZEXT464((uint)rVar16);
                local_f94.all_params.
                super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                _M_impl.super__Vector_impl_data._4_8_ =
                     (double)rVar16 +
                     (double)local_f94.all_params.
                             super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                             ._M_impl.super__Vector_impl_data._4_8_;
                cnn::ComputationGraph::~ComputationGraph
                          ((ComputationGraph *)in_stack_ffffffffffffea90);
                __gnu_cxx::
                __normal_iterator<Instance_*,_std::vector<Instance,_std::allocator<Instance>_>_>::
                operator++(&local_fb0);
              }
              eval = false;
              auVar25 = vcvtusi2sd_avx512f(auVar25,local_f94.all_params.
                                                                                                      
                                                  super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
              local_1010 = local_fa0 / auVar25._0_8_;
              auVar25 = vcvtusi2sd_avx512f(auVar25,local_f98);
              local_1018 = local_fa0 / auVar25._0_8_;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_1010 + local_1018;
              auVar25._0_8_ = (local_1010 * 2.0 * local_1018) / (local_1010 + local_1018);
              auVar25._8_8_ = 0;
              local_1020 = auVar25._0_8_;
              if (local_860 < auVar25._0_8_) {
                local_860 = auVar25._0_8_;
                std::ofstream::ofstream(local_1220,local_858,0x10);
                boost::archive::text_oarchive::text_oarchive
                          ((text_oarchive *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,
                           in_stack_ffffffffffffeaa4);
                boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::
                operator<<((interface_oarchive<boost::archive::text_oarchive> *)
                           in_stack_ffffffffffffea90,(Model *)in_stack_ffffffffffffea88);
                boost::archive::text_oarchive::~text_oarchive((text_oarchive *)0x38b9db);
                auVar25 = std::ofstream::~ofstream(local_1220);
                auVar24._0_8_ = auVar25._8_8_;
                auVar18._0_8_ = auVar25._0_8_;
                auVar24._8_56_ = extraout_var_04;
                auVar19 = auVar24._0_16_;
                auVar18._8_56_ = extraout_var;
                auVar25 = auVar18._0_16_;
              }
              poVar6 = std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
              auVar25 = vcvtusi2sd_avx512f(auVar25,iVar26);
              dVar17 = auVar25._0_8_;
              sVar13 = std::vector<Instance,_std::allocator<Instance>_>::size(&local_28);
              auVar25 = vcvtusi2sd_avx512f(auVar19,sVar13);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar17 / auVar25._0_8_);
              in_stack_ffffffffffffead0 = (Timer *)std::operator<<(poVar6,"] P = ");
              poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffead0,local_1010);
              in_stack_ffffffffffffeac0 = (ComputationGraph *)std::operator<<(poVar6," R = ");
              poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffeac0,local_1018);
              in_stack_ffffffffffffeab0 = (Dict *)std::operator<<(poVar6," F=");
              in_stack_ffffffffffffeaa8 =
                   (ostream *)std::ostream::operator<<(in_stack_ffffffffffffeab0,local_1020);
              std::operator<<(in_stack_ffffffffffffeaa8,' ');
            }
            cnn::Timer::~Timer(in_stack_ffffffffffffead0);
          } while( true );
        }
        local_3e8 = local_3e8 + 1;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x38a95d);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)0x38a972);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)0x38a987);
        in_stack_ffffffffffffea98 = (Model *)(local_3f4 + 4);
        in_stack_ffffffffffffea90 = (Model *)local_3f4;
        in_stack_ffffffffffffea88 = &ld;
        ReadSentencePair((string *)poVar6,(vector<int,_std::allocator<int>_> *)s,pDVar9,
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)c_00,(Dict *)CONCAT44(uVar3,in_stack_ffffffffffffecd0),
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)l,in_stack_ffffffffffffed00,in_stack_ffffffffffffed08,
                         (int *)CONCAT17(in_stack_ffffffffffffed17,in_stack_ffffffffffffed10));
        sVar13 = std::vector<int,_std::allocator<int>_>::size(&local_618);
        sVar11 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::size(&local_630);
        if (sVar13 != sVar11) break;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_ffffffffffffeae0,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_ffffffffffffead8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_ffffffffffffeae0,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_ffffffffffffead8);
        Instance::Instance(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,
                           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
        std::vector<Instance,_std::allocator<Instance>_>::push_back
                  ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffea90,
                   (value_type *)in_stack_ffffffffffffea88);
        Instance::~Instance((Instance *)in_stack_ffffffffffffea90);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
        sVar13 = std::vector<int,_std::allocator<int>_>::size(&local_618);
        local_3ec = local_3ec + (int)sVar13;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
      }
      __assert_fail("x.size() == y.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                    ,0x206,"int main(int, char **)");
    }
    local_64 = local_64 + 1;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x389fd4);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x389fe9);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x389ffe);
    in_stack_ffffffffffffea98 = (Model *)(local_7c + 4);
    in_stack_ffffffffffffea90 = (Model *)local_7c;
    in_stack_ffffffffffffea88 = &ld;
    ReadSentencePair(in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,
                     in_stack_ffffffffffffecd8,
                     (Dict *)CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
                     in_stack_ffffffffffffecc8,in_stack_ffffffffffffed00,in_stack_ffffffffffffed08,
                     (int *)CONCAT17(in_stack_ffffffffffffed17,in_stack_ffffffffffffed10));
    in_stack_ffffffffffffed08 = (int *)std::vector<int,_std::allocator<int>_>::size(&local_2a0);
    piVar8 = (int *)std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::size(&local_2b8);
    in_stack_ffffffffffffed17 = false;
    if (in_stack_ffffffffffffed08 == piVar8) {
      in_stack_ffffffffffffed00 = (Dict *)std::vector<int,_std::allocator<int>_>::size(&local_2a0);
      pDVar9 = (Dict *)std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::size(&local_2d0);
      in_stack_ffffffffffffed17 = in_stack_ffffffffffffed00 == pDVar9;
    }
    if ((bool)in_stack_ffffffffffffed17 == false) break;
    sVar13 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
    if (sVar13 == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,local_60);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      abort();
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffeae0,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffead8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffeae0,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_ffffffffffffead8);
    Instance::Instance(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
    std::vector<Instance,_std::allocator<Instance>_>::push_back
              ((vector<Instance,_std::allocator<Instance>_> *)in_stack_ffffffffffffea90,
               (value_type *)in_stack_ffffffffffffea88);
    Instance::~Instance((Instance *)in_stack_ffffffffffffea90);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
    sVar13 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
    local_68 = local_68 + (int)sVar13;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0));
  }
  __assert_fail("x.size() == y.size() && x.size() == c.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/e-hierarchy-trainer-CH.cc"
                ,0x1e3,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 3 && argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  ostringstream os;
  os << "ordered"
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << "-pid" << getpid() << ".params";
  const string fname = os.str();
  cerr << "Parameters will be written to: " << fname << endl;
  double best = -9e+99;

  Model model;
  bool use_momentum = true;
  Trainer* sgd = nullptr;
  if (use_momentum)
    sgd = new MomentumSGDTrainer(&model);
  else
    sgd = new SimpleSGDTrainer(&model);

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
  if (argc == 4) {
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  unsigned report_every_i = 50;
  unsigned dev_every_i_reports = 25;
  unsigned si = training.size();
  vector<unsigned> order(training.size());
  for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
  bool first = true;
  int report = 0;
  unsigned lines = 0;
  while(1) {
    Timer iteration("completed in");
    double loss = 0;
    unsigned tpredict = 0;
    unsigned toverall = 0;
    double correct = 0;
    for (unsigned i = 0; i < report_every_i; ++i) {
      if (si == training.size()) {
        si = 0;
        if (first) { first = false; } else { sgd->update_epoch(); }
        cerr << "**SHUFFLE\n";
        shuffle(order.begin(), order.end(), *rndeng);
      }

      // build graph for this instance
      ComputationGraph cg;
      auto& sent = training[order[si]];
//      cerr<<si<<" "<<order[si]<<endl;
//      sent.show();
      ++si;
      lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &correct, &tpredict, &toverall, true);
//      cerr<<"done"<<endl;
      loss += as_scalar(cg.forward());
      cg.backward();
      sgd->update(1.0);
      ++lines;
    }
    sgd->status();
    cerr << " E = " << (loss / toverall) << " ppl=" << exp(loss / toverall) << " (acc=" << (correct / toverall) << ") ";

    // show score on dev data?
    report++;
    if (report % dev_every_i_reports == 0) {
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;
      eval = true;
      //lm.p_th2t->scale_parameters(pdrop);
      for (auto& sent : dev) {
        ComputationGraph cg;
        lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
      }
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      if (F > best) {
        best = F;
        ofstream out(fname);
        boost::archive::text_oarchive oa(out);
        oa << model;
      }
      cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] P = " << P << " R = " << R << " F=" << F << ' ';
    }
  }
  delete sgd;
}